

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O2

void __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::CreateStringImpl
          (FlatBufferBuilderImpl<false> *this,char *str,size_t len)

{
  NotNested(this);
  PreAlign<unsigned_int>(this,len + 1);
  vector_downward<unsigned_int>::fill(&this->buf_,1);
  vector_downward<unsigned_int>::push(&this->buf_,(uint8_t *)str,len);
  PushElement<unsigned_int,unsigned_int>(this,(uint)len);
  return;
}

Assistant:

void CreateStringImpl(const char *str, size_t len) {
    NotNested();
    PreAlign<uoffset_t>(len + 1);  // Always 0-terminated.
    buf_.fill(1);
    PushBytes(reinterpret_cast<const uint8_t *>(str), len);
    PushElement(static_cast<uoffset_t>(len));
  }